

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O0

void __thiscall leveldb::Histogram::Add(Histogram *this,double value)

{
  bool bVar1;
  int local_1c;
  int b;
  double value_local;
  Histogram *this_local;
  
  local_1c = 0;
  while( true ) {
    bVar1 = false;
    if (local_1c < 0x99) {
      bVar1 = *(double *)(kBucketLimit + (long)local_1c * 8) <= value;
    }
    if (!bVar1) break;
    local_1c = local_1c + 1;
  }
  this->buckets_[local_1c] = this->buckets_[local_1c] + 1.0;
  if (value < this->min_) {
    this->min_ = value;
  }
  if (this->max_ < value) {
    this->max_ = value;
  }
  this->num_ = this->num_ + 1.0;
  this->sum_ = value + this->sum_;
  this->sum_squares_ = value * value + this->sum_squares_;
  return;
}

Assistant:

void Histogram::Add(double value) {
  // Linear search is fast enough for our usage in db_bench
  int b = 0;
  while (b < kNumBuckets - 1 && kBucketLimit[b] <= value) {
    b++;
  }
  buckets_[b] += 1.0;
  if (min_ > value) min_ = value;
  if (max_ < value) max_ = value;
  num_++;
  sum_ += value;
  sum_squares_ += (value * value);
}